

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O2

RGBA __thiscall glcts::DrawBuffersIndexedBlending::GetEpsilon(DrawBuffersIndexedBlending *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  int iVar3;
  int *piVar4;
  long lVar5;
  double dVar6;
  UVec4 epsilon;
  IVec4 bits;
  Vector<unsigned_int,_4> local_48;
  Vector<int,_4> local_38;
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  tcu::Vector<int,_4>::Vector(&local_38);
  tcu::Vector<unsigned_int,_4>::Vector(&local_48);
  iVar3 = 0xd52;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
    piVar4 = (int *)((long)local_38.m_data + lVar5);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(iVar3,piVar4);
    dVar6 = ldexp(1.0,*piVar4);
    dVar6 = ceil((1.0 / dVar6) * 255.0 + 1.0);
    uVar2 = (uint)(long)dVar6;
    if (0xfe < uVar2) {
      uVar2 = 0xff;
    }
    *(uint *)((long)local_48.m_data + lVar5) = uVar2;
    iVar3 = iVar3 + 1;
  }
  return (RGBA)(local_48.m_data[1] << 8 | local_48.m_data[0] |
               local_48.m_data[2] << 0x10 | local_48.m_data[3] << 0x18);
}

Assistant:

tcu::RGBA DrawBuffersIndexedBlending::GetEpsilon()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	tcu::IVec4 bits;
	tcu::UVec4 epsilon;

	for (int i = 0; i < 4; ++i)
	{
		gl.getIntegerv(GL_RED_BITS + i, &bits[i]);
		epsilon[i] = de::min(
			255u, static_cast<unsigned int>(ceil(1.0 + 255.0 * (1.0 / pow(2.0, static_cast<double>(bits[i]))))));
	}

	return tcu::RGBA(epsilon.x(), epsilon.y(), epsilon.z(), epsilon.w());
}